

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O2

int little2_scanPercent(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte bVar1;
  byte bVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  
  uVar3 = (long)end - (long)ptr;
  if ((long)uVar3 < 2) {
    return -1;
  }
  bVar1 = ptr[1];
  iVar4 = 0;
  if (bVar1 - 0xd8 < 4) {
LAB_006077ff:
    iVar5 = iVar4;
    if (uVar3 < 4) {
      return -2;
    }
    goto switchD_006077b2_caseD_13;
  }
  iVar5 = 0;
  if (bVar1 - 0xdc < 4) goto switchD_006077b2_caseD_13;
  if (bVar1 == 0) {
    bVar2 = *(byte *)((long)enc[1].scanners + (ulong)(byte)*ptr);
    iVar5 = iVar4;
    switch(bVar2) {
    case 0x16:
    case 0x18:
      goto switchD_006077e7_caseD_16;
    case 0x17:
    case 0x19:
    case 0x1a:
    case 0x1b:
    case 0x1c:
      break;
    case 0x1d:
      goto switchD_006077e7_caseD_1d;
    default:
      if (1 < bVar2 - 9) {
        if (bVar2 == 6) {
LAB_0060782d:
          iVar5 = iVar4;
          if (uVar3 == 2) {
            return -2;
          }
          break;
        }
joined_r0x006077fd:
        iVar5 = iVar4;
        if (bVar2 != 7) break;
        goto LAB_006077ff;
      }
    case 0x15:
    case 0x1e:
      iVar5 = 0x16;
    }
  }
  else {
    if ((bVar1 == 0xff) && (iVar5 = iVar4, 0xfd < (byte)*ptr)) goto switchD_006077b2_caseD_13;
switchD_006077e7_caseD_1d:
    iVar5 = iVar4;
    if ((*(uint *)((long)namingBitmap +
                  (ulong)((byte)*ptr >> 3 & 0x1c | (uint)"\x02\x03\x04\x05\x06\a\b"[bVar1] << 5)) >>
         ((byte)*ptr & 0x1f) & 1) != 0) {
switchD_006077e7_caseD_16:
      ptr = ptr + 2;
      while( true ) {
        uVar3 = uVar3 - 2;
        if ((long)uVar3 < 2) {
          return -1;
        }
        bVar1 = ((byte *)ptr)[1];
        if (bVar1 == 0) break;
        if (bVar1 == 0xff) {
          iVar5 = iVar4;
          if (0xfd < (byte)*ptr) goto switchD_006077b2_caseD_13;
        }
        else {
          if (bVar1 - 0xd8 < 4) goto LAB_006077ff;
          iVar5 = iVar4;
          if (bVar1 - 0xdc < 4) goto switchD_006077b2_caseD_13;
        }
switchD_006077b2_caseD_1d:
        iVar5 = iVar4;
        if ((*(uint *)((long)namingBitmap +
                      (ulong)((byte)*ptr >> 3 & 0x1c |
                             (uint)"\x19\x03\x1a\x1b\x1c\x1d\x1e"[bVar1] << 5)) >>
             ((byte)*ptr & 0x1f) & 1) == 0) goto switchD_006077b2_caseD_13;
switchD_006077b2_caseD_16:
        ptr = (char *)((byte *)ptr + 2);
      }
      bVar2 = *(byte *)((long)enc[1].scanners + (ulong)(byte)*ptr);
      iVar5 = iVar4;
      switch(bVar2) {
      case 0x12:
        ptr = (char *)((byte *)ptr + 2);
        iVar5 = 0x1c;
      case 0x13:
      case 0x14:
      case 0x15:
      case 0x17:
      case 0x1c:
        break;
      case 0x16:
      case 0x18:
      case 0x19:
      case 0x1a:
      case 0x1b:
        goto switchD_006077b2_caseD_16;
      case 0x1d:
        goto switchD_006077b2_caseD_1d;
      default:
        if (bVar2 != 6) goto joined_r0x006077fd;
        goto LAB_0060782d;
      }
    }
  }
switchD_006077b2_caseD_13:
  *nextTokPtr = ptr;
  return iVar5;
}

Assistant:

static int PTRCALL
PREFIX(scanPercent)(const ENCODING *enc, const char *ptr, const char *end,
                    const char **nextTokPtr) {
  REQUIRE_CHAR(enc, ptr, end);
  switch (BYTE_TYPE(enc, ptr)) {
    CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
  case BT_S:
  case BT_LF:
  case BT_CR:
  case BT_PERCNT:
    *nextTokPtr = ptr;
    return XML_TOK_PERCENT;
  default:
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  }
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
      CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
    case BT_SEMI:
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_PARAM_ENTITY_REF;
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return XML_TOK_PARTIAL;
}